

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool print_value(cJSON *item,printbuffer *output_buffer)

{
  double b;
  char cVar1;
  long lVar2;
  uchar uVar3;
  cJSON_bool cVar4;
  cJSON_bool cVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  uchar *puVar9;
  size_t i;
  ulong uVar10;
  ulong uVar11;
  uchar uVar12;
  size_t needed;
  long lVar13;
  cJSON *item_00;
  cJSON *pcVar14;
  size_t needed_00;
  long in_FS_OFFSET;
  undefined1 auVar15 [16];
  double local_60;
  uchar number_buffer [26];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  cVar5 = 0;
  cVar4 = 0;
  if (output_buffer != (printbuffer *)0x0 && item != (cJSON *)0x0) {
    cVar1 = (char)item->type;
    cVar4 = cVar5;
    switch(cVar1) {
    case '\x01':
      puVar9 = ensure(output_buffer,6);
      if (puVar9 != (uchar *)0x0) {
        builtin_memcpy(puVar9,"false",6);
        goto LAB_0010422a;
      }
      break;
    case '\x02':
      puVar9 = ensure(output_buffer,5);
      if (puVar9 != (uchar *)0x0) {
        builtin_memcpy(puVar9,"true",5);
        goto LAB_0010422a;
      }
      break;
    case '\x03':
    case '\x05':
    case '\x06':
    case '\a':
      break;
    case '\x04':
      puVar9 = ensure(output_buffer,5);
      if (puVar9 != (uchar *)0x0) {
        builtin_memcpy(puVar9,"null",5);
        goto LAB_0010422a;
      }
      break;
    case '\b':
      b = item->valuedouble;
      number_buffer._16_10_ = SUB1610((undefined1  [16])0x0,6);
      number_buffer[0] = '\0';
      number_buffer[1] = '\0';
      number_buffer[2] = '\0';
      number_buffer[3] = '\0';
      number_buffer[4] = '\0';
      number_buffer[5] = '\0';
      number_buffer[6] = '\0';
      number_buffer[7] = '\0';
      number_buffer[8] = '\0';
      number_buffer[9] = '\0';
      number_buffer[10] = '\0';
      number_buffer[0xb] = '\0';
      number_buffer[0xc] = '\0';
      number_buffer[0xd] = '\0';
      number_buffer[0xe] = '\0';
      number_buffer[0xf] = '\0';
      uVar3 = get_decimal_point();
      local_60 = 0.0;
      if ((ulong)ABS(b) < 0x7ff0000000000000) {
        uVar6 = sprintf((char *)number_buffer,"%1.15g",b);
        iVar7 = __isoc99_sscanf(number_buffer,"%lg",&local_60);
        if ((iVar7 != 1) || (cVar4 = compare_double(local_60,b), cVar4 == 0)) {
          uVar6 = sprintf((char *)number_buffer,"%1.17g",b);
        }
        if (0x19 < uVar6) goto LAB_0010421a;
      }
      else {
        builtin_memcpy(number_buffer,"null",5);
        uVar6 = 4;
      }
      uVar10 = (ulong)uVar6;
      puVar9 = ensure(output_buffer,uVar10 + 1);
      if (puVar9 == (uchar *)0x0) goto LAB_0010421a;
      for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
        uVar12 = number_buffer[uVar11];
        if (uVar12 == uVar3) {
          uVar12 = '.';
        }
        puVar9[uVar11] = uVar12;
      }
      puVar9[uVar10] = '\0';
      output_buffer->offset = output_buffer->offset + uVar10;
LAB_0010422a:
      cVar4 = 1;
      break;
    default:
      if (cVar1 == '\x10') {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          cVar4 = print_string_ptr((uchar *)item->valuestring,output_buffer);
          return cVar4;
        }
        goto LAB_0010424c;
      }
      if (cVar1 == ' ') {
        pcVar14 = item->child;
        puVar9 = ensure(output_buffer,1);
        if (puVar9 != (uchar *)0x0) {
          *puVar9 = '[';
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          output_buffer->offset = output_buffer->offset + 1;
          output_buffer->depth = output_buffer->depth - auVar15._8_8_;
          while (item_00 = pcVar14, item_00 != (cJSON *)0x0) {
            cVar5 = print_value(item_00,output_buffer);
            cVar4 = 0;
            if (cVar5 == 0) goto switchD_00103e3b_caseD_3;
            update_offset(output_buffer);
            pcVar14 = (cJSON *)0x0;
            if (item_00->next != (cJSON *)0x0) {
              uVar10 = (ulong)(output_buffer->format == 0);
              puVar9 = ensure(output_buffer,uVar10 ^ 3);
              if (puVar9 == (uchar *)0x0) goto switchD_00103e3b_caseD_3;
              *puVar9 = ',';
              if (output_buffer->format == 0) {
                puVar9 = puVar9 + 1;
              }
              else {
                puVar9[1] = ' ';
                puVar9 = puVar9 + 2;
              }
              *puVar9 = '\0';
              output_buffer->offset = output_buffer->offset + (2 - uVar10);
              pcVar14 = item_00->next;
            }
          }
          puVar9 = ensure(output_buffer,2);
          if (puVar9 != (uchar *)0x0) {
            puVar9[0] = ']';
            puVar9[1] = '\0';
LAB_00104226:
            output_buffer->depth = output_buffer->depth - 1;
            goto LAB_0010422a;
          }
LAB_0010421a:
          cVar4 = 0;
        }
      }
      else if (cVar1 == '@') {
        pcVar14 = item->child;
        uVar10 = (ulong)(output_buffer->format == 0);
        puVar9 = ensure(output_buffer,uVar10 ^ 3);
        if (puVar9 != (uchar *)0x0) {
          needed_00 = 2;
          *puVar9 = '{';
          output_buffer->depth = output_buffer->depth + 1;
          if (output_buffer->format != 0) {
            puVar9[1] = '\n';
          }
          output_buffer->offset = output_buffer->offset + (2 - uVar10);
          cVar4 = 0;
          for (; pcVar14 != (cJSON *)0x0; pcVar14 = pcVar14->next) {
            if (output_buffer->format != 0) {
              puVar9 = ensure(output_buffer,output_buffer->depth);
              if (puVar9 == (uchar *)0x0) goto LAB_0010421a;
              for (uVar10 = 0; uVar10 < output_buffer->depth; uVar10 = uVar10 + 1) {
                puVar9[uVar10] = '\t';
              }
              output_buffer->offset = output_buffer->offset + output_buffer->depth;
            }
            cVar5 = print_string_ptr((uchar *)pcVar14->string,output_buffer);
            if (cVar5 == 0) goto switchD_00103e3b_caseD_3;
            update_offset(output_buffer);
            needed = 2 - (ulong)(output_buffer->format == 0);
            puVar9 = ensure(output_buffer,needed);
            if (puVar9 == (uchar *)0x0) goto switchD_00103e3b_caseD_3;
            *puVar9 = ':';
            if (output_buffer->format != 0) {
              puVar9[1] = '\t';
            }
            output_buffer->offset = output_buffer->offset + needed;
            cVar5 = print_value(pcVar14,output_buffer);
            if (cVar5 == 0) goto switchD_00103e3b_caseD_3;
            update_offset(output_buffer);
            lVar13 = ((ulong)(pcVar14->next != (cJSON *)0x0) + 1) -
                     (ulong)(output_buffer->format == 0);
            puVar9 = ensure(output_buffer,lVar13 + 1);
            if (puVar9 == (uchar *)0x0) goto switchD_00103e3b_caseD_3;
            if (pcVar14->next != (cJSON *)0x0) {
              *puVar9 = ',';
              puVar9 = puVar9 + 1;
            }
            if (output_buffer->format != 0) {
              *puVar9 = '\n';
              puVar9 = puVar9 + 1;
            }
            *puVar9 = '\0';
            output_buffer->offset = output_buffer->offset + lVar13;
          }
          if (output_buffer->format != 0) {
            needed_00 = output_buffer->depth + 1;
          }
          puVar9 = ensure(output_buffer,needed_00);
          if (puVar9 != (uchar *)0x0) {
            if (output_buffer->format != 0) {
              for (uVar10 = 0; uVar10 < output_buffer->depth - 1; uVar10 = uVar10 + 1) {
                puVar9[uVar10] = '\t';
              }
              puVar9 = puVar9 + uVar10;
            }
            puVar9[0] = '}';
            puVar9[1] = '\0';
            goto LAB_00104226;
          }
          goto LAB_0010421a;
        }
      }
      else {
        cVar4 = 0;
        if ((cVar1 == -0x80) && (cVar4 = cVar5, item->valuestring != (char *)0x0)) {
          sVar8 = strlen(item->valuestring);
          puVar9 = ensure(output_buffer,sVar8 + 1);
          if (puVar9 != (uchar *)0x0) {
            memcpy(puVar9,item->valuestring,sVar8 + 1);
            goto LAB_0010422a;
          }
        }
      }
    }
  }
switchD_00103e3b_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return cVar4;
  }
LAB_0010424c:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool print_value(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output = NULL;

    if ((item == NULL) || (output_buffer == NULL))
    {
        return false;
    }

    switch ((item->type) & 0xFF)
    {
        case cJSON_NULL:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "null");
            return true;

        case cJSON_False:
            output = ensure(output_buffer, 6);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "false");
            return true;

        case cJSON_True:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "true");
            return true;

        case cJSON_Number:
            return print_number(item, output_buffer);

        case cJSON_Raw:
        {
            size_t raw_length = 0;
            if (item->valuestring == NULL)
            {
                return false;
            }

            raw_length = strlen(item->valuestring) + sizeof("");
            output = ensure(output_buffer, raw_length);
            if (output == NULL)
            {
                return false;
            }
            memcpy(output, item->valuestring, raw_length);
            return true;
        }

        case cJSON_String:
            return print_string(item, output_buffer);

        case cJSON_Array:
            return print_array(item, output_buffer);

        case cJSON_Object:
            return print_object(item, output_buffer);

        default:
            return false;
    }
}